

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendV1Version
          (V2TransportTester *this,MessageStartChars *magic)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_58;
  long lStack_40;
  CMessageHeader hdr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = RandomMixin<FastRandomContext>::randrange<int>
                    (&this->m_rng->super_RandomMixin<FastRandomContext>,0xb);
  CMessageHeader::CMessageHeader(&hdr,magic,"version",iVar2 + 0x7e);
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lStack_40 = 0;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CMessageHeader::SerializationOps<DataStream,CMessageHeader_const,ActionSerialize>(&hdr);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_to_send,
             (const_iterator)
             (this->m_to_send).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish,
             local_58._M_impl.super__Vector_impl_data._M_start + lStack_40,
             local_58._M_impl.super__Vector_impl_data._M_finish);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendV1Version(const MessageStartChars& magic)
    {
        CMessageHeader hdr(magic, "version", 126 + m_rng.randrange(11));
        DataStream ser{};
        ser << hdr;
        m_to_send.insert(m_to_send.end(), UCharCast(ser.data()), UCharCast(ser.data() + ser.size()));
    }